

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

void __thiscall
duckdb::PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
PrimitiveDictionary(PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
                    *this,Allocator *allocator_p,idx_t maximum_size_p,
                   idx_t maximum_target_capacity_p)

{
  Allocator *pAVar1;
  undefined1 auVar2 [16];
  idx_t iVar3;
  uchar *puVar4;
  uint32_t *puVar5;
  ulong uVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  
  this->allocator = allocator_p;
  this->maximum_size = maximum_size_p;
  this->size = 0;
  iVar3 = duckdb::NextPowerOfTwo(maximum_size_p * 2);
  this->capacity = iVar3;
  this->capacity_mask = iVar3 - 1;
  this->maximum_target_capacity = maximum_target_capacity_p;
  pAVar1 = this->allocator;
  puVar4 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar1);
  duckdb::AllocatedData::AllocatedData(&this->allocated_dictionary,pAVar1,puVar4,iVar3 * 0x18);
  pAVar1 = this->allocator;
  uVar6 = 0x100000;
  if (this->maximum_target_capacity < 0x100000) {
    uVar6 = this->maximum_target_capacity;
  }
  puVar4 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar1);
  duckdb::AllocatedData::AllocatedData(&this->allocated_target,pAVar1,puVar4,uVar6);
  duckdb::MemoryStream::MemoryStream
            (&this->target_stream,*(uchar **)&this->field_0x50,*(ulong *)&this->field_0x58);
  iVar3 = this->capacity;
  this->dictionary = *(primitive_dictionary_entry_t **)&this->field_0x38;
  this->full = false;
  auVar2 = _DAT_003b4370;
  if (iVar3 != 0) {
    uVar6 = iVar3 + 3 & 0xfffffffffffffffc;
    lVar7 = iVar3 - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    puVar5 = &(*(primitive_dictionary_entry_t **)&this->field_0x38)[3].index;
    auVar8 = auVar8 ^ _DAT_003b4370;
    auVar10 = _DAT_003b4350;
    auVar11 = _DAT_003b4360;
    do {
      auVar12 = auVar11 ^ auVar2;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_)
                & 1)) {
        puVar5[-0x12] = 0xffffffff;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        puVar5[-0xc] = 0xffffffff;
      }
      auVar12 = auVar10 ^ auVar2;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
        puVar5[-6] = 0xffffffff;
        *puVar5 = 0xffffffff;
      }
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar7 + 4;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar7 + 4;
      puVar5 = puVar5 + 0x18;
      uVar6 = uVar6 - 4;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}